

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O3

void __thiscall dgMatrix::dgMatrix(dgMatrix *this,dgQuaternion *rotation,dgVector *position)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar1 = (float)rotation->m_q3;
  fVar2 = (float)rotation->m_q0;
  fVar3 = (float)rotation->m_q2;
  fVar4 = (float)rotation->m_q1;
  fVar5 = fVar3 + fVar3;
  fVar6 = fVar4 + fVar4;
  fVar8 = fVar1 * (fVar1 + fVar1);
  fVar9 = (fVar1 + fVar1) * fVar2;
  fVar7 = fVar9 + fVar6 * fVar3;
  fVar10 = fVar1 * fVar6 - fVar5 * fVar2;
  fVar11 = (1.0 - fVar5 * fVar3) - fVar8;
  if ((((!NAN(fVar10)) && ((uint)ABS(fVar10) < 0x7f800000)) && (!NAN(fVar7))) &&
     (((uint)ABS(fVar11) < 0x7f800000 && ((uint)ABS(fVar7) < 0x7f800000)))) {
    fVar9 = fVar6 * fVar3 - fVar9;
    (this->m_front).super_dgTemplateVector<float>.m_x = fVar11;
    (this->m_front).super_dgTemplateVector<float>.m_y = fVar7;
    (this->m_front).super_dgTemplateVector<float>.m_z = fVar10;
    (this->m_front).super_dgTemplateVector<float>.m_w = 0.0;
    fVar7 = 1.0 - fVar4 * fVar6;
    fVar4 = fVar5 * fVar1 + fVar6 * fVar2;
    fVar8 = fVar7 - fVar8;
    if (((!NAN(fVar4)) && (((uint)ABS(fVar4) < 0x7f800000 && (!NAN(fVar8))))) &&
       (((uint)ABS(fVar9) < 0x7f800000 && ((uint)ABS(fVar8) < 0x7f800000)))) {
      fVar10 = fVar1 * fVar6 + fVar5 * fVar2;
      fVar1 = fVar5 * fVar1 - fVar6 * fVar2;
      fVar7 = fVar7 - fVar5 * fVar3;
      (this->m_up).super_dgTemplateVector<float>.m_x = fVar9;
      (this->m_up).super_dgTemplateVector<float>.m_y = fVar8;
      (this->m_up).super_dgTemplateVector<float>.m_z = fVar4;
      (this->m_up).super_dgTemplateVector<float>.m_w = 0.0;
      if ((((!NAN(fVar7)) && ((uint)ABS(fVar7) < 0x7f800000)) && (!NAN(fVar1))) &&
         (((uint)ABS(fVar10) < 0x7f800000 && ((uint)ABS(fVar1) < 0x7f800000)))) {
        (this->m_right).super_dgTemplateVector<float>.m_x = fVar10;
        (this->m_right).super_dgTemplateVector<float>.m_y = fVar1;
        (this->m_right).super_dgTemplateVector<float>.m_z = fVar7;
        (this->m_right).super_dgTemplateVector<float>.m_w = 0.0;
        fVar1 = (position->super_dgTemplateVector<float>).m_y;
        (this->m_posit).super_dgTemplateVector<float>.m_x =
             (position->super_dgTemplateVector<float>).m_x;
        (this->m_posit).super_dgTemplateVector<float>.m_y = fVar1;
        (this->m_posit).super_dgTemplateVector<float>.m_z =
             (position->super_dgTemplateVector<float>).m_z;
        (this->m_posit).super_dgTemplateVector<float>.m_w = 1.0;
        return;
      }
    }
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
}

Assistant:

dgMatrix::dgMatrix (const dgQuaternion &rotation, const dgVector &position)
{
	hacd::HaF32 x2 = hacd::HaF32 (2.0f) * rotation.m_q1 * rotation.m_q1;
	hacd::HaF32 y2 = hacd::HaF32 (2.0f) * rotation.m_q2 * rotation.m_q2;
	hacd::HaF32 z2 = hacd::HaF32 (2.0f) * rotation.m_q3 * rotation.m_q3;

#ifdef _DEBUG
	hacd::HaF32 w2 = hacd::HaF32 (2.0f) * rotation.m_q0 * rotation.m_q0;
	HACD_ASSERT (dgAbsf (w2 + x2 + y2 + z2 - hacd::HaF32(2.0f)) <hacd::HaF32 (1.0e-3f));
#endif

	hacd::HaF32 xy = hacd::HaF32 (2.0f) * rotation.m_q1 * rotation.m_q2;
	hacd::HaF32 xz = hacd::HaF32 (2.0f) * rotation.m_q1 * rotation.m_q3;
	hacd::HaF32 xw = hacd::HaF32 (2.0f) * rotation.m_q1 * rotation.m_q0;
	hacd::HaF32 yz = hacd::HaF32 (2.0f) * rotation.m_q2 * rotation.m_q3;
	hacd::HaF32 yw = hacd::HaF32 (2.0f) * rotation.m_q2 * rotation.m_q0;
	hacd::HaF32 zw = hacd::HaF32 (2.0f) * rotation.m_q3 * rotation.m_q0;

	m_front = dgVector (hacd::HaF32(1.0f) - y2 - z2, xy + zw,                   xz - yw				    , hacd::HaF32(0.0f));
	m_up    = dgVector (xy - zw,                   hacd::HaF32(1.0f) - x2 - z2, yz + xw					, hacd::HaF32(0.0f));
	m_right = dgVector (xz + yw,                   yz - xw,                   hacd::HaF32(1.0f) - x2 - y2 , hacd::HaF32(0.0f));


	m_posit.m_x = position.m_x;
	m_posit.m_y = position.m_y;
	m_posit.m_z = position.m_z;
	m_posit.m_w = hacd::HaF32(1.0f);
}